

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DArrayInt
          (GatherBase *this,int slices,int data_slice)

{
  GLenum type;
  long lVar1;
  reference pixels_00;
  undefined1 local_d8 [8];
  IVec4 data [4];
  int local_90;
  int i_1;
  allocator<tcu::Vector<int,_4>_> local_79;
  Vector<int,_4> local_78;
  undefined1 local_68 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  string local_48 [4];
  int i;
  GLenum local_28;
  int local_24;
  GLenum tex_type;
  GLint size;
  GLint csize;
  GLenum internal_format;
  int data_slice_local;
  int slices_local;
  GatherBase *this_local;
  
  csize = data_slice;
  internal_format = slices;
  _data_slice_local = this;
  size = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  tex_type = 0x20;
  local_24 = 0x20;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(local_48);
  lVar1 = std::__cxx11::string::find((char)local_48,0x75);
  local_28 = 0x1404;
  if (lVar1 != -1) {
    local_28 = 0x1405;
  }
  std::__cxx11::string::~string(local_48);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < local_24; local_24 = local_24 / 2) {
    glu::CallLogWrapper::glTexImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
               pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,size,local_24,local_24,
               internal_format,0,0x8d99,local_28,(void *)0x0);
    pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  tcu::Vector<int,_4>::Vector(&local_78,999);
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_79);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_68,0x400,
             &local_78,&local_79);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_79);
  for (local_90 = 0; type = local_28, local_90 < (int)internal_format; local_90 = local_90 + 1) {
    pixels_00 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           local_68,0);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0
               ,0,0,local_90,0x20,0x20,1,0x8d99,type,pixels_00);
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_d8,0xc,0xd,0xe,0xf);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[0].m_data + 2),8,9,10,0xb);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[1].m_data + 2),0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[2].m_data + 2),4,5,6,7);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x16,0x19,csize,2,2,1,0x8d99,local_28,local_d8);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x10,10,csize,1,1,1,0x8d99,local_28,local_d8);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0xb,2,csize,1,1,1,0x8d99,local_28,data[0].m_data + 2);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x18,0xd,csize,1,1,1,0x8d99,local_28,data[1].m_data + 2);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,9
             ,0xe,csize,1,1,1,0x8d99,local_28,data[2].m_data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2800,0x2600);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_68);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArrayInt(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		tex_type		= Type().find('u') != std::string::npos ? GL_UNSIGNED_INT : GL_INT;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, GL_RGBA_INTEGER, tex_type, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int i = 0; i < slices; ++i)
		{
			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, i, csize, csize, 1, GL_RGBA_INTEGER, tex_type, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, GL_RGBA_INTEGER, tex_type, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, GL_RGBA_INTEGER, tex_type, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, GL_RGBA_INTEGER, tex_type, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, GL_RGBA_INTEGER, tex_type, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, GL_RGBA_INTEGER, tex_type, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}